

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O1

void __thiscall
DynamicProfileStorageReaderWriter::Close(DynamicProfileStorageReaderWriter *this,bool deleteFile)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0xca,"(file)","file");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  PAL_fflush(this->file);
  PAL_fclose(this->file);
  this->file = (PAL_FILE *)0x0;
  if (deleteFile) {
    DeleteFileW(this->filename);
  }
  this->filename = (char16 *)0x0;
  return;
}

Assistant:

void DynamicProfileStorageReaderWriter::Close(bool deleteFile)
{
    AssertOrFailFast(file);
    fflush(file);
    fclose(file);
    file = nullptr;
    if (deleteFile)
    {
        _wunlink(filename);
    }
    filename = nullptr;
}